

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O1

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices
          (CoalesceLocalsWithLearning *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  pointer *this_00;
  double dVar1;
  uint uVar2;
  default_delete<Order> *pdVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  long *plVar4;
  long lVar5;
  undefined8 this_01;
  pointer puVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  Order *pOVar10;
  result_type rVar11;
  Order *pOVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  Order *pOVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  Order *pOVar20;
  undefined1 local_2808 [8];
  Generator generator;
  GeneticLearner<Order,_double,_Generator> learner;
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  local_88;
  undefined1 auStack_68 [8];
  Index removedCopies;
  pointer local_58;
  long local_48;
  Order *local_40;
  ulong local_38;
  
  sVar8 = Function::getNumVars
                    ((this->super_CoalesceLocals).
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     .
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .
                     super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                     .
                     super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .currFunction);
  if (sVar8 < 2) {
    CoalesceLocals::pickIndices(&this->super_CoalesceLocals,indices);
    return;
  }
  sVar8 = Function::getNumVars
                    ((this->super_CoalesceLocals).
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     .
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .
                     super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                     .
                     super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .currFunction);
  uVar19 = ((int)sVar8 + -1) * (int)sVar8;
  generator.parent = (CoalesceLocalsWithLearning *)0x2a;
  uVar13 = 0x2a;
  lVar9 = 2;
  do {
    uVar13 = (ulong)((((uint)(uVar13 >> 0x1e) ^ (uint)uVar13) * 0x6c078965 + (int)lVar9) - 1);
    generator.noise._M_x[lVar9 + -2] = uVar13;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x271);
  generator._5008_8_ = local_2808;
  generator.noise._M_x[0x26f] = 0x270;
  generator.noise._M_p._0_1_ = 1;
  learner.generator = (Generator *)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  learner.population.
  super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x539;
  uVar13 = 0x539;
  lVar9 = 5;
  do {
    uVar13 = (ulong)((((uint)(uVar13 >> 0x1e) ^ (uint)uVar13) * 0x6c078965 + (int)lVar9) - 4);
    learner.noise._M_x[lVar9 + -5] = uVar13;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x274);
  pOVar16 = (Order *)0x14;
  if (uVar19 < 0x14) {
    pOVar16 = (Order *)(ulong)uVar19;
  }
  learner.noise._M_x[0x26f] = 0x270;
  pOVar12 = pOVar16;
  local_2808 = (undefined1  [8])this;
  std::
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ::resize((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
            *)&learner,(size_type)pOVar16);
  if (uVar19 != 0) {
    pOVar20 = (Order *)0x0;
    do {
      pOVar10 = pickIndices::Generator::makeRandom((Generator *)local_2808);
      pdVar3 = (default_delete<Order> *)
               ((learner.generator)->noise)._M_x[(long)((long)&pOVar20[-1].fitness + 7)];
      ((learner.generator)->noise)._M_x[(long)((long)&pOVar20[-1].fitness + 7)] =
           (unsigned_long)pOVar10;
      if (pdVar3 != (default_delete<Order> *)0x0) {
        std::default_delete<Order>::operator()(pdVar3,pOVar12);
      }
      pOVar20 = (Order *)((long)&(pOVar20->super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                 ).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
    } while (pOVar16 != pOVar20);
  }
  GeneticLearner<Order,_double,_Generator>::sort
            ((GeneticLearner<Order,_double,_Generator> *)&generator.first);
  uVar13 = ((learner.generator)->parent->super_CoalesceLocals).
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           .super_Pass.name._M_string_length;
  do {
    uVar18 = (long)learner.population.
                   super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)learner.generator >> 3;
    uVar17 = uVar18 * 0x32;
    pOVar16 = (Order *)(uVar17 / 100);
    local_88.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    learner.noise._M_p = uVar13;
    local_40 = pOVar16;
    std::
    vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ::resize(&local_88,(size_type)pOVar16);
    puVar6 = local_88.
             super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (uVar18 * 0x19) / 100;
    if (99 < uVar17) {
      local_48 = (long)&(local_40->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + (ulong)(local_40 == (Order *)0x0);
      lVar9 = 0;
      do {
        this_01 = generator._5008_8_;
        this_00 = &learner.population.
                   super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        rVar11 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)this_00);
        __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((learner.generator)->noise)._M_x
              [rVar11 % (ulong)((long)learner.population.
                                      super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start -
                                (long)learner.generator >> 3) - 1];
        rVar11 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)this_00);
        plVar4 = (long *)((learner.generator)->noise)._M_x
                         [rVar11 % (ulong)((long)learner.population.
                                                 super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                           (long)learner.generator >> 3) - 1];
        uVar13 = (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        auStack_68 = (undefined1  [8])0x0;
        _removedCopies = (pointer)0x0;
        local_58 = (pointer)0x0;
        iVar15 = (int)uVar13;
        uVar13 = uVar13 & 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,uVar13);
        if (iVar15 != 0) {
          lVar5 = *plVar4;
          uVar14 = 0;
          do {
            *(uint *)((long)auStack_68 + (ulong)*(uint *)(lVar5 + uVar14 * 4) * 4) = (uint)uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        pOVar12 = (Order *)operator_new(0x20);
        *(undefined8 *)
         &(pOVar12->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> = 0;
        *(pointer *)
         ((long)&(pOVar12->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) = (pointer)0x0
        ;
        *(pointer *)
         ((long)&(pOVar12->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10) =
             (pointer)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar12,__x);
        pOVar12->fitness =
             (double)__x[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        if (iVar15 == 0) {
          __assert_fail("size >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                        ,699,
                        "Order *wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<Index> &)::Generator::makeMixture(Order *, Order *)"
                       );
        }
        uVar13 = Function::getNumParams(*(Function **)(*(long *)this_01 + 0x120));
        if ((uint)uVar13 < iVar15 - 1U) {
          lVar5 = *(long *)&(pOVar12->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
          do {
            iVar7 = (int)uVar13;
            uVar13 = uVar13 & 0xffffffff;
            uVar19 = *(uint *)(lVar5 + uVar13 * 4);
            uVar2 = *(uint *)(lVar5 + 4 + uVar13 * 4);
            if (*(uint *)((long)auStack_68 + (ulong)uVar2 * 4) <
                *(uint *)((long)auStack_68 + (ulong)uVar19 * 4)) {
              iVar7 = iVar7 + 1;
              *(uint *)(lVar5 + uVar13 * 4) = uVar2;
              *(uint *)(lVar5 + (uVar13 + 1) * 4) = uVar19;
            }
            uVar13 = (ulong)(iVar7 + 1U);
          } while (iVar7 + 1U < iVar15 - 1U);
        }
        pOVar16 = pOVar12;
        pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator::
        calculateFitness(wasm::CoalesceLocalsWithLearning::
        pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__
                  ((void *)this_01,pOVar12);
        if (auStack_68 != (undefined1  [8])0x0) {
          pOVar16 = (Order *)((long)local_58 - (long)auStack_68);
          operator_delete((void *)auStack_68,(ulong)pOVar16);
        }
        pOVar20 = puVar6[lVar9]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
                  super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
                  super__Head_base<0UL,_Order_*,_false>._M_head_impl;
        puVar6[lVar9]._M_t.super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
        super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
        super__Head_base<0UL,_Order_*,_false>._M_head_impl = pOVar12;
        if (pOVar20 != (Order *)0x0) {
          std::default_delete<Order>::operator()((default_delete<Order> *)pOVar20,pOVar16);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_48);
      if (99 < uVar17) {
        lVar9 = 0;
        do {
          pOVar16 = (Order *)(((learner.generator)->noise)._M_x + (local_38 - 1));
          pOVar12 = (Order *)(&(pOVar16->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start)[lVar9];
          (&(pOVar16->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start)[lVar9] =
               (pointer)local_88.
                        super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                        super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
                        super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
                        super__Head_base<0UL,_Order_*,_false>._M_head_impl;
          local_88.
          super__Vector_base<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
          super___uniq_ptr_impl<Order,_std::default_delete<Order>_>._M_t.
          super__Tuple_impl<0UL,_Order_*,_std::default_delete<Order>_>.
          super__Head_base<0UL,_Order_*,_false>._M_head_impl = pOVar12;
          lVar9 = lVar9 + 1;
        } while (local_48 != lVar9);
      }
    }
    for (uVar13 = (long)&(local_40->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_38; uVar13 < uVar18;
        uVar13 = uVar13 + 1) {
      pOVar12 = pickIndices::Generator::makeRandom((Generator *)generator._5008_8_);
      pdVar3 = (default_delete<Order> *)((learner.generator)->noise)._M_x[uVar13 - 1];
      ((learner.generator)->noise)._M_x[uVar13 - 1] = (unsigned_long)pOVar12;
      if (pdVar3 != (default_delete<Order> *)0x0) {
        std::default_delete<Order>::operator()(pdVar3,pOVar16);
      }
    }
    GeneticLearner<Order,_double,_Generator>::sort
              ((GeneticLearner<Order,_double,_Generator> *)&generator.first);
    std::
    vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
    ::~vector(&local_88);
    dVar1 = (double)((learner.generator)->parent->super_CoalesceLocals).
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    .super_Pass.name._M_string_length;
    uVar13 = learner.noise._M_p & -(ulong)(dVar1 == (double)learner.noise._M_p) |
             ~-(ulong)(dVar1 == (double)learner.noise._M_p) & (ulong)dVar1;
  } while ((dVar1 != (double)learner.noise._M_p) || (NAN(dVar1) || NAN((double)learner.noise._M_p)))
  ;
  CoalesceLocals::pickIndicesFromOrder
            (&this->super_CoalesceLocals,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(learner.generator)->parent,
             indices,(Index *)auStack_68);
  std::
  vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
  ::~vector((vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
             *)&learner);
  return;
}

Assistant:

void CoalesceLocalsWithLearning::pickIndices(std::vector<Index>& indices) {
  if (getFunction()->getNumVars() <= 1) {
    // nothing to think about here
    CoalesceLocals::pickIndices(indices);
    return;
  }

  struct Order : public std::vector<Index> {
    void setFitness(double f) { fitness = f; }
    double getFitness() { return fitness; }
    void dump(std::string text) {
      std::cout << text + ": ( ";
      for (Index i = 0; i < size(); i++) {
        std::cout << (*this)[i] << " ";
      }
      std::cout << ")\n";
      std::cout << "of quality: " << getFitness() << "\n";
    }

  private:
    double fitness;
  };

  struct Generator {
    Generator(CoalesceLocalsWithLearning* parent) : parent(parent), noise(42) {}

    void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }

    Order* makeRandom() {
      auto* ret = new Order;
      ret->resize(parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        (*ret)[i] = i;
      }
      if (first) {
        // as the first guess, use the natural order. this is not arbitrary for
        // two reasons. first, there may be an inherent order in the input
        // (frequent indices are lower, etc.). second, by ensuring we start with
        // the natural order, we ensure we are at least as good as the
        // non-learning variant.
        // TODO: use ::pickIndices from the parent, so we literally get the
        //       simpler approach as our first option
        first = false;
      } else {
        // leave params alone, shuffle the rest
        std::shuffle(ret->begin() + parent->getFunction()->getNumParams(),
                     ret->end(),
                     noise);
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      order->dump("new rando");
#endif
      return ret;
    }

    Order* makeMixture(Order* left, Order* right) {
      // perturb left using right. this is useful since
      // we don't care about absolute locations, relative ones matter more,
      // and a true merge of two vectors could obscure that (e.g.
      // a.......... and ..........a would merge a into the middle, for no
      // reason), and cause a lot of unnecessary noise
      Index size = left->size();
      Order reverseRight; // reverseRight[x] is the index of x in right
      reverseRight.resize(size);
      for (Index i = 0; i < size; i++) {
        reverseRight[(*right)[i]] = i;
      }
      auto* ret = new Order;
      *ret = *left;
      assert(size >= 1);
      for (Index i = parent->getFunction()->getNumParams(); i < size - 1; i++) {
        // if (i, i + 1) is in reverse order in right, flip them
        if (reverseRight[(*ret)[i]] > reverseRight[(*ret)[i + 1]]) {
          std::swap((*ret)[i], (*ret)[i + 1]);
          // if we don't skip, we might end up pushing an element all the way to
          // the end, which is not very perturbation-y
          i++;
        }
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      ret->dump("new mixture");
#endif
      return ret;
    }

  private:
    CoalesceLocalsWithLearning* parent;
    std::mt19937 noise;
    bool first = true;
  };

#ifdef CFG_LEARN_DEBUG
  std::cout << "[learning for " << getFunction()->name << "]\n";
#endif
  auto numVars = this->getFunction()->getNumVars();
  const int GENERATION_SIZE =
    std::min(Index(numVars * (numVars - 1)), Index(20));
  Generator generator(this);
  GeneticLearner<Order, double, Generator> learner(generator, GENERATION_SIZE);
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("first best");
#endif
  // keep working while we see improvement
  auto oldBest = learner.getBest()->getFitness();
  while (1) {
    learner.runGeneration();
    auto newBest = learner.getBest()->getFitness();
    if (newBest == oldBest) {
      break; // unlikely we can improve
    }
    oldBest = newBest;
#ifdef CFG_LEARN_DEBUG
    learner.getBest()->dump("current best");
#endif
  }
#ifdef CFG_LEARN_DEBUG
  learner.getBest()->dump("the best");
#endif
  // TODO: cache indices in Orders, at the cost of more memory?
  this->pickIndicesFromOrder(*learner.getBest(), indices);
}